

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O1

void __thiscall
wasm::SimplifyLocals<true,_true,_true>::optimizeLoopReturn
          (SimplifyLocals<true,_true,_true> *this,Loop *loop)

{
  pointer *pppLVar1;
  Block *this_00;
  iterator __position;
  size_t sVar2;
  Module *pMVar3;
  Expression **ppEVar4;
  LocalSet *this_01;
  mapped_type *pmVar5;
  Expression *pEVar6;
  ulong uVar7;
  optional<wasm::Type> type_;
  optional<wasm::Type> type__00;
  _Rb_tree_color local_3c;
  Loop *pLStack_38;
  Index goodIndex;
  Loop *loop_local;
  
  if (((loop->super_SpecificExpression<(wasm::Expression::Id)3>).super_Expression.type.id == 0) &&
     ((this->sinkables)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    local_3c = (this->sinkables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color;
    this_00 = (Block *)loop->body;
    pLStack_38 = loop;
    if (((this_00->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id ==
         BlockId) &&
       ((((this_00->name).super_IString.str._M_str == (char *)0x0 &&
         (sVar2 = (this_00->list).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                  usedElements, sVar2 != 0)) &&
        ((this_00->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
         data[sVar2 - 1]->_id == NopId)))) {
      pMVar3 = (this->
               super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
               ).
               super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
               .
               super_PostWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
               .
               super_Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
               .currModule;
      pmVar5 = std::
               map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
               ::at(&this->sinkables,&local_3c);
      ppEVar4 = pmVar5->item;
      this_01 = (LocalSet *)*ppEVar4;
      if ((this_01->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id !=
          LocalSetId) {
        __assert_fail("int(_id) == int(T::SpecificId)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                      ,0x31b,"T *wasm::Expression::cast() [T = wasm::LocalSet]");
      }
      sVar2 = (this_00->list).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements;
      if (sVar2 == 0) {
        __assert_fail("index < usedElements",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                      ,0xbc,
                      "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                     );
      }
      (this_00->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      data[sVar2 - 1] = this_01->value;
      uVar7 = 0x10;
      pEVar6 = (Expression *)MixedArena::allocSpace(&pMVar3->allocator,0x10,8);
      pEVar6->_id = NopId;
      (pEVar6->type).id = 0;
      *ppEVar4 = pEVar6;
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar7;
      Block::finalize(this_00,type_,Unknown);
      if ((this_00->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id == 0
         ) {
        __assert_fail("block->type != Type::none",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                      ,0x1ee,
                      "void wasm::SimplifyLocals<>::optimizeLoopReturn(Loop *) [allowTee = true, allowStructure = true, allowNesting = true]"
                     );
      }
      type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar7;
      Loop::finalize(pLStack_38,type__00);
      this_01->value = (Expression *)pLStack_38;
      LocalSet::finalize(this_01);
      Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
      ::replaceCurrent((Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                        *)&(this->
                           super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                           ).
                           super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                       ,(Expression *)this_01);
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>,_std::_Select1st<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
      ::clear(&(this->sinkables)._M_t);
      this->anotherCycle = true;
    }
    else {
      __position._M_current =
           (this->loopsToEnlarge).super__Vector_base<wasm::Loop_*,_std::allocator<wasm::Loop_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->loopsToEnlarge).super__Vector_base<wasm::Loop_*,_std::allocator<wasm::Loop_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<wasm::Loop*,std::allocator<wasm::Loop*>>::_M_realloc_insert<wasm::Loop*const&>
                  ((vector<wasm::Loop*,std::allocator<wasm::Loop*>> *)&this->loopsToEnlarge,
                   __position,&stack0xffffffffffffffc8);
      }
      else {
        *__position._M_current = loop;
        pppLVar1 = &(this->loopsToEnlarge).
                    super__Vector_base<wasm::Loop_*,_std::allocator<wasm::Loop_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppLVar1 = *pppLVar1 + 1;
      }
    }
  }
  return;
}

Assistant:

void optimizeLoopReturn(Loop* loop) {
    // If there is a sinkable thing in an eligible loop, we can optimize
    // it in a trivial way to the outside of the loop.
    if (loop->type != Type::none) {
      return;
    }
    if (sinkables.empty()) {
      return;
    }
    Index goodIndex = sinkables.begin()->first;
    // Ensure we have a place to write the return values for, if not, we
    // need another cycle.
    auto* block = loop->body->dynCast<Block>();
    if (!block || block->name.is() || block->list.size() == 0 ||
        !block->list.back()->is<Nop>()) {
      loopsToEnlarge.push_back(loop);
      return;
    }
    Builder builder(*this->getModule());
    auto** item = sinkables.at(goodIndex).item;
    auto* set = (*item)->template cast<LocalSet>();
    block->list[block->list.size() - 1] = set->value;
    *item = builder.makeNop();
    block->finalize();
    assert(block->type != Type::none);
    loop->finalize();
    set->value = loop;
    set->finalize();
    this->replaceCurrent(set);
    // We moved things around, clear all tracking; we'll do another cycle
    // anyhow.
    sinkables.clear();
    anotherCycle = true;
  }